

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O0

double * __thiscall Network::predict(Network *this,double *inputs,size_t length)

{
  Matrix *pMVar1;
  Matrix *unmappedMatrix;
  size_t i_1;
  size_t i;
  size_t length_local;
  double *inputs_local;
  Network *this_local;
  
  if (length == (*this->layers)->nodeCount) {
    for (i_1 = 0; i_1 < length; i_1 = i_1 + 1) {
      (*this->layers)->neurons[i_1] = inputs[i_1];
    }
    for (unmappedMatrix = (Matrix *)0x1; unmappedMatrix < (Matrix *)this->layerCount;
        unmappedMatrix = (Matrix *)((long)&unmappedMatrix->rows + 1)) {
      pMVar1 = Matrix::multiply(this->layers[(long)unmappedMatrix]->weights,
                                this->layers[(long)((long)&unmappedMatrix[-1].data + 7)]->neurons,
                                this->layers[(long)((long)&unmappedMatrix[-1].data + 7)]->nodeCount)
      ;
      pMVar1 = Matrix::add(pMVar1,this->layers[(long)unmappedMatrix]->biases,
                           this->layers[(long)unmappedMatrix]->nodeCount);
      Matrix::apply(pMVar1,this->layers[(long)unmappedMatrix]->func,
                    this->layers[(long)unmappedMatrix]->neurons,
                    this->layers[(long)unmappedMatrix]->nodeCount);
      if (pMVar1 != (Matrix *)0x0) {
        Matrix::~Matrix(pMVar1);
        operator_delete(pMVar1,0x18);
      }
    }
    this_local = (Network *)this->layers[this->layerCount - 1]->neurons;
  }
  else {
    std::operator<<((ostream *)&std::cout,"Inputs don\'t match Input Model Layer");
    this_local = (Network *)0x0;
  }
  return (double *)this_local;
}

Assistant:

double* Network::predict(double* inputs, size_t length) const {
	if (length != layers[0]->nodeCount) {
		std::cout << "Inputs don't match Input Model Layer";
		return nullptr;
	}

	/* Set the input layer neurons to the passed inputs */
	for (size_t i = 0; i < length; ++i) {
		layers[0]->neurons[i] = inputs[i];
	}

	/* Feed forward algorithm */
	for (size_t i = 1; i < layerCount; i++) {
		/*
		 * 1. Multiply previous Neurons with current index I weights to get new Neuron Matrix for index I
		 * 2. add() bias to calclulated neurons
		 * 3. apply() Activation Function to squeeze numbers to specific regions
		 */
		Matrix* unmappedMatrix = Matrix::multiply(layers[i]->weights, layers[i - 1]->neurons, layers[i - 1]->nodeCount)
			->add(layers[i]->biases, layers[i]->nodeCount);
		unmappedMatrix->apply(layers[i]->func, layers[i]->neurons, layers[i]->nodeCount);
		delete unmappedMatrix;
	}

	/* Return predicted output which are just the last neurons */
	return layers[layerCount - 1]->neurons;
}